

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_true,_false>::insert_edge_(DaTrie<false,_true,_false> *this,Query *query)

{
  uint uVar1;
  pointer pBVar2;
  pointer pNVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((uint)(byte)query->key_[query->pos_] ^
                 *(uint *)(pBVar2 + query->node_pos_) & 0x7fffffff);
  if ((long)pBVar2[uVar6] < 0) {
    solve_(this,query);
    uVar6 = (ulong)((uint)(byte)query->key_[query->pos_] ^
                   *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start + query->node_pos_) &
                   0x7fffffff);
  }
  fix_(this,(uint32_t)uVar6,&this->blocks_);
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2[uVar6] =
       (Bc)((ulong)pBVar2[uVar6] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((uint)pNVar3[query->node_pos_].child ^
          *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_start + query->node_pos_)) * 2;
  pNVar3[uVar6].sib = (&pNVar3->sib)[uVar5];
  pcVar4 = query->key_;
  uVar1 = query->pos_;
  (&pNVar3->sib)[uVar5] = pcVar4[uVar1];
  query->node_pos_ = (uint32_t)uVar6;
  query->pos_ = uVar1 + 1;
  query->is_finished_ = pcVar4[uVar1] == '\0';
  return;
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }